

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O2

void __thiscall
ON_SimpleArray<ON_MeshPart>::Append(ON_SimpleArray<ON_MeshPart> *this,ON_MeshPart *x)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  ON_MeshPart *pOVar4;
  ON_MeshPart *pOVar5;
  
  iVar3 = this->m_count;
  pOVar4 = x;
  if (iVar3 == this->m_capacity) {
    iVar3 = NewCapacity(this);
    if ((this->m_a <= x) && (x < this->m_a + this->m_capacity)) {
      pOVar4 = (ON_MeshPart *)onmalloc(0x18);
      uVar1 = *(undefined8 *)x->fi;
      *(undefined8 *)pOVar4->vi = *(undefined8 *)x->vi;
      *(undefined8 *)pOVar4->fi = uVar1;
      iVar2 = x->triangle_count;
      pOVar4->vertex_count = x->vertex_count;
      pOVar4->triangle_count = iVar2;
    }
    Reserve(this,(long)iVar3);
    pOVar5 = this->m_a;
    if (pOVar5 == (ON_MeshPart *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
    iVar3 = this->m_count;
  }
  else {
    pOVar5 = this->m_a;
  }
  this->m_count = iVar3 + 1;
  iVar2 = pOVar4->triangle_count;
  pOVar5[iVar3].vertex_count = pOVar4->vertex_count;
  pOVar5[iVar3].triangle_count = iVar2;
  uVar1 = *(undefined8 *)pOVar4->fi;
  *(undefined8 *)pOVar5[iVar3].vi = *(undefined8 *)pOVar4->vi;
  *(undefined8 *)pOVar5[iVar3].fi = uVar1;
  if (pOVar4 != x) {
    onfree(pOVar4);
    return;
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}